

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O0

void xmlSAX2AttributeDecl
               (void *ctx,xmlChar *elem,xmlChar *fullname,int type,int def,xmlChar *defaultValue,
               xmlEnumerationPtr tree)

{
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  xmlChar *pxStack_50;
  int tmp;
  xmlChar *prefix;
  xmlChar *name;
  xmlAttributePtr attr;
  xmlParserCtxtPtr ctxt;
  xmlChar *defaultValue_local;
  int def_local;
  int type_local;
  xmlChar *fullname_local;
  xmlChar *elem_local;
  void *ctx_local;
  
  prefix = (xmlChar *)0x0;
  pxStack_50 = (xmlChar *)0x0;
  if ((ctx != (void *)0x0) && (*(long *)((long)ctx + 0x10) != 0)) {
    attr = (xmlAttributePtr)ctx;
    ctxt = (xmlParserCtxtPtr)defaultValue;
    defaultValue_local._0_4_ = def;
    defaultValue_local._4_4_ = type;
    _def_local = fullname;
    fullname_local = elem;
    elem_local = (xmlChar *)ctx;
    iVar2 = xmlStrEqual(fullname,(xmlChar *)"xml:id");
    if ((iVar2 != 0) && (defaultValue_local._4_4_ != XML_ATTRIBUTE_ID)) {
      uVar1 = *(undefined4 *)&attr[1].last;
      xmlErrValid((xmlParserCtxtPtr)attr,XML_DTD_XMLID_TYPE,"xml:id : attribute type should be ID\n"
                  ,(xmlChar *)0x0,(xmlChar *)0x0);
      *(undefined4 *)&attr[1].last = uVar1;
    }
    prefix = xmlSplitQName4(_def_local,&stack0xffffffffffffffb0);
    if (prefix == (xmlChar *)0x0) {
      xmlSAX2ErrMemory((xmlParserCtxtPtr)attr);
    }
    *(undefined4 *)&attr[1].prefix = 1;
    if (*(int *)&attr[2].tree == 1) {
      name = (xmlChar *)
             xmlAddAttributeDecl((xmlValidCtxtPtr)&attr[1].parent,*(xmlDtdPtr *)(attr->name + 0x50),
                                 fullname_local,prefix,pxStack_50,defaultValue_local._4_4_,
                                 (xmlAttributeDefault)defaultValue_local,(xmlChar *)ctxt,tree);
    }
    else {
      if (*(int *)&attr[2].tree != 2) {
        xmlFatalErrMsg((xmlParserCtxtPtr)attr,XML_ERR_INTERNAL_ERROR,
                       "SAX.xmlSAX2AttributeDecl(%s) called while not in subset\n",prefix,
                       (xmlChar *)0x0);
        (*xmlFree)(pxStack_50);
        xmlFreeEnumeration(tree);
        return;
      }
      name = (xmlChar *)
             xmlAddAttributeDecl((xmlValidCtxtPtr)&attr[1].parent,*(xmlDtdPtr *)(attr->name + 0x58),
                                 fullname_local,prefix,pxStack_50,defaultValue_local._4_4_,
                                 (xmlAttributeDefault)defaultValue_local,(xmlChar *)ctxt,tree);
    }
    if (*(int *)&attr[1].prefix == 0) {
      *(undefined4 *)&attr[1].last = 0;
    }
    if ((((name != (xmlChar *)0x0) && (*(int *)((long)&attr[1].last + 4) != 0)) &&
        (*(int *)&attr->children != 0)) && (*(long *)(attr->name + 0x50) != 0)) {
      uVar3 = xmlValidateAttributeDecl
                        ((xmlValidCtxtPtr)&attr[1].parent,(xmlDocPtr)attr->name,
                         (xmlAttributePtr)name);
      *(uint *)&attr[1].last = uVar3 & *(uint *)&attr[1].last;
    }
    if (pxStack_50 != (xmlChar *)0x0) {
      (*xmlFree)(pxStack_50);
    }
  }
  return;
}

Assistant:

void
xmlSAX2AttributeDecl(void *ctx, const xmlChar *elem, const xmlChar *fullname,
              int type, int def, const xmlChar *defaultValue,
	      xmlEnumerationPtr tree)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlAttributePtr attr;
    const xmlChar *name = NULL;
    xmlChar *prefix = NULL;

    /* Avoid unused variable warning if features are disabled. */
    (void) attr;

    if ((ctxt == NULL) || (ctxt->myDoc == NULL))
        return;

    if ((xmlStrEqual(fullname, BAD_CAST "xml:id")) &&
        (type != XML_ATTRIBUTE_ID)) {
	/*
	 * Raise the error but keep the validity flag
	 */
	int tmp = ctxt->valid;
	xmlErrValid(ctxt, XML_DTD_XMLID_TYPE,
	      "xml:id : attribute type should be ID\n", NULL, NULL);
	ctxt->valid = tmp;
    }
    name = xmlSplitQName4(fullname, &prefix);
    if (name == NULL)
        xmlSAX2ErrMemory(ctxt);
    ctxt->vctxt.valid = 1;
    if (ctxt->inSubset == 1)
	attr = xmlAddAttributeDecl(&ctxt->vctxt, ctxt->myDoc->intSubset, elem,
	       name, prefix, (xmlAttributeType) type,
	       (xmlAttributeDefault) def, defaultValue, tree);
    else if (ctxt->inSubset == 2)
	attr = xmlAddAttributeDecl(&ctxt->vctxt, ctxt->myDoc->extSubset, elem,
	   name, prefix, (xmlAttributeType) type,
	   (xmlAttributeDefault) def, defaultValue, tree);
    else {
        xmlFatalErrMsg(ctxt, XML_ERR_INTERNAL_ERROR,
	     "SAX.xmlSAX2AttributeDecl(%s) called while not in subset\n",
	               name, NULL);
	xmlFree(prefix);
	xmlFreeEnumeration(tree);
	return;
    }
#ifdef LIBXML_VALID_ENABLED
    if (ctxt->vctxt.valid == 0)
	ctxt->valid = 0;
    if ((attr != NULL) && (ctxt->validate) && (ctxt->wellFormed) &&
        (ctxt->myDoc->intSubset != NULL))
	ctxt->valid &= xmlValidateAttributeDecl(&ctxt->vctxt, ctxt->myDoc,
	                                        attr);
#endif /* LIBXML_VALID_ENABLED */
    if (prefix != NULL)
	xmlFree(prefix);
}